

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O1

bool __thiscall
cmBinUtilsMacOSMachOLinker::ResolveDependency
          (cmBinUtilsMacOSMachOLinker *this,string *name,string *executablePath,string *loaderPath,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rpaths,string *path,bool *resolved)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  cmBinUtilsMacOSMachOLinker *pcVar4;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  string local_60;
  cmBinUtilsMacOSMachOLinker *local_40;
  __node_base local_38;
  
  *resolved = false;
  local_60._M_string_length = (size_type)(name->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)name->_M_string_length;
  __str._M_str = "@rpath/";
  __str._M_len = 7;
  local_38._M_nxt = (_Hash_node_base *)rpaths;
  iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_60,0,7,__str);
  local_40 = this;
  if (iVar2 == 0) {
    ResolveRPathDependency
              (this,name,executablePath,loaderPath,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38._M_nxt,path,resolved);
  }
  else {
    local_60._M_string_length = (size_type)(name->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)name->_M_string_length;
    pcVar4 = (cmBinUtilsMacOSMachOLinker *)&local_60;
    __str_00._M_str = "@loader_path/";
    __str_00._M_len = 0xd;
    iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)pcVar4,0,0xd,__str_00);
    if (iVar2 == 0) {
      ResolveLoaderPathDependency(pcVar4,name,loaderPath,path,resolved);
    }
    else {
      local_60._M_string_length = (size_type)(name->_M_dataplus)._M_p;
      local_60._M_dataplus._M_p = (pointer)name->_M_string_length;
      pcVar4 = (cmBinUtilsMacOSMachOLinker *)&local_60;
      __str_01._M_str = "@executable_path/";
      __str_01._M_len = 0x11;
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)pcVar4,0,0x11,__str_01)
      ;
      if (iVar2 == 0) {
        ResolveExecutablePathDependency(pcVar4,name,executablePath,path,resolved);
      }
      else {
        *resolved = true;
        std::__cxx11::string::_M_assign((string *)path);
      }
    }
  }
  bVar3 = true;
  if (*resolved == true) {
    bVar1 = cmsys::SystemTools::FileIsFullPath(path);
    if (!bVar1) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Resolved path is not absolute","");
      cmBinUtilsLinker::SetError(&local_40->super_cmBinUtilsLinker,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::ResolveDependency(
  std::string const& name, std::string const& executablePath,
  std::string const& loaderPath, std::vector<std::string> const& rpaths,
  std::string& path, bool& resolved)
{
  resolved = false;
  if (cmHasLiteralPrefix(name, "@rpath/")) {
    if (!this->ResolveRPathDependency(name, executablePath, loaderPath, rpaths,
                                      path, resolved)) {
      return false;
    }
  } else if (cmHasLiteralPrefix(name, "@loader_path/")) {
    if (!this->ResolveLoaderPathDependency(name, loaderPath, path, resolved)) {
      return false;
    }
  } else if (cmHasLiteralPrefix(name, "@executable_path/")) {
    if (!this->ResolveExecutablePathDependency(name, executablePath, path,
                                               resolved)) {
      return false;
    }
  } else {
    resolved = true;
    path = name;
  }

  if (resolved && !cmSystemTools::FileIsFullPath(path)) {
    this->SetError("Resolved path is not absolute");
    return false;
  }

  return true;
}